

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O1

void __thiscall test_adjacency_graph_degree_Test::TestBody(test_adjacency_graph_degree_Test *this)

{
  AssertHelper AVar1;
  AssertHelper AVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Adjacency_Graph<true> graph;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_160;
  AssertHelper local_158;
  int local_14c;
  undefined1 local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  Adjacency_Graph<false> local_60 [48];
  
  local_148 = (undefined1  [8])0x3;
  local_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_138._0_1_ = false;
  uStack_138._1_7_ = 0;
  local_130 = 1;
  local_128 = 7;
  local_120 = 4;
  local_118 = 6;
  local_110 = 7;
  local_108 = 2;
  local_100 = 5;
  local_f8 = 3;
  local_f0 = 4;
  local_e8 = 6;
  local_e0 = 3;
  local_d8 = 4;
  local_d0 = 5;
  local_c8 = 4;
  local_c0 = 6;
  local_b8 = 7;
  local_b0 = 4;
  local_a8 = 5;
  local_a0 = 7;
  local_98 = 2;
  local_90 = 1;
  local_88 = 1;
  local_80 = 4;
  edge_graph._M_len = 0xd;
  edge_graph._M_array = (iterator)local_148;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_60,edge_graph);
  local_158.data_ = (AssertHelperData *)0x0;
  local_160._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Graph<false>::degree(local_60,(size_t *)&local_158);
  local_14c = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"graph.degree(0)","2",(unsigned_long *)&local_160,&local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_160._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_140._M_pi);
  }
  local_158.data_ = (AssertHelperData *)0x3;
  local_160._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Graph<false>::degree(local_60,(size_t *)&local_158);
  local_14c = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"graph.degree(3)","3",(unsigned_long *)&local_160,&local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_160._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_140._M_pi);
  }
  local_158.data_ = (AssertHelperData *)&DAT_00000004;
  local_160._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Graph<false>::degree(local_60,(size_t *)&local_158);
  local_14c = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"graph.degree(4)","5",(unsigned_long *)&local_160,&local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_140._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_160._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_160._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_140._M_pi);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_160._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1592e8;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_148,
               (testing *)&local_160,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)local_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("1 == graph.degree(50)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,0x22e,(DeathTest **)&local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    AVar1.data_ = local_158.data_;
    bVar3 = true;
    if (bVar4) {
      if (local_158.data_ != (AssertHelperData *)0x0) {
        iVar6 = (**(code **)(*(long *)local_158.data_ + 0x10))(local_158.data_);
        AVar2.data_ = local_158.data_;
        if (iVar6 == 0) {
          iVar6 = (**(code **)(*(long *)local_158.data_ + 0x18))(local_158.data_);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar6);
          cVar5 = (**(code **)(*(long *)AVar2.data_ + 0x20))(AVar2.data_,bVar3);
          if (cVar5 != '\0') goto LAB_0011f2dd;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              local_148 = (undefined1  [8])0x32;
              Disa::Adjacency_Graph<false>::degree(local_60,(size_t *)local_148);
            }
            (**(code **)(*(long *)local_158.data_ + 0x28))(local_158.data_,2);
            (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
          }
LAB_0011f2dd:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*(long *)AVar1.data_ + 8))(AVar1.data_);
        if (!bVar4) goto LAB_0011f2f0;
      }
      bVar3 = false;
    }
LAB_0011f2f0:
    if (!bVar3) goto LAB_0011f34a;
  }
  testing::Message::Message((Message *)local_148);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
             ,0x22e,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)local_148);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
  if (local_148 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_148 + 8))();
  }
LAB_0011f34a:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_60);
  return;
}

Assistant:

TEST(test_adjacency_graph, degree) {

  Adjacency_Graph<false> graph = create_graph_hybrid();

  EXPECT_EQ(graph.degree(0), 2);
  EXPECT_EQ(graph.degree(3), 3);
  EXPECT_EQ(graph.degree(4), 5);
  EXPECT_DEATH(1 == graph.degree(50), "./*");
}